

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::build
          (BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive> *this)

{
  PrimInfoT<embree::BBox<embree::Vec3fa>_> *__new_size;
  uint64_t *puVar1;
  long lVar2;
  unsigned_long uVar3;
  void *pvVar4;
  undefined8 *puVar5;
  int iVar6;
  undefined8 uVar7;
  size_t sVar8;
  ulong uVar9;
  char cVar10;
  long *plVar11;
  long lVar12;
  void *pvVar13;
  long lVar14;
  runtime_error *prVar15;
  uint uVar16;
  anon_union_8_2_d71db6ad_for_task_group_context_11 *paVar17;
  ulong uVar18;
  ulong uVar19;
  task_group_context *bounds;
  NodeRefPtr<4> root;
  size_t sVar20;
  BVHN<4> *pBVar21;
  PrimInfoT<embree::BBox<embree::Vec3fa>_> *pPVar22;
  undefined8 *puVar23;
  ulong uVar24;
  ulong numPrimitives;
  double dVar25;
  undefined1 auVar26 [16];
  anon_class_1_0_00000001 local_229;
  task_group_context context;
  string __str;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  size_t local_f8;
  size_t sStack_f0;
  blocked_range<unsigned_long> local_e8;
  anon_class_8_1_8991fb9c local_d0;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_twolevel_cpp:146:16)>
  body;
  anon_class_16_2_ed117de8_conflict33 local_58;
  anon_class_24_3_8ee612a4_conflict4 local_48;
  
  __new_size = *(PrimInfoT<embree::BBox<embree::Vec3fa>_> **)(*(long *)(this + 0x30) + 0x1d8);
  pPVar22 = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)
            (*(long *)(*(long *)(this + 0x28) + 0x208) - *(long *)(*(long *)(this + 0x28) + 0x200)
            >> 3);
  if (__new_size < pPVar22) {
    context.my_version = proxy_support;
    context.my_traits = (context_traits)0x4;
    context.my_node.my_prev_node = (intrusive_list_node *)0x0;
    context.my_node.my_next_node = (intrusive_list_node *)0x0;
    context.my_name = CUSTOM_CTX;
    local_138._0_8_ = this;
    tbb::detail::r1::initialize(&context);
    body.my_reduction = (anon_class_1_0_00000001 *)0x1;
    __str._M_dataplus._M_p = (pointer)&local_138;
    body.my_identity_element = pPVar22;
    body.my_real_body = (anon_class_16_2_ed117de8_conflict33 *)__new_size;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&body,(anon_class_8_1_898bcfc2 *)&__str,
          (auto_partitioner *)&local_e8,&context);
    cVar10 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar10 != '\0') {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar15,"task cancelled");
      __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&context);
  }
  FastAllocator::reset((FastAllocator *)(*(long *)(this + 0x28) + 0x78));
  lVar14 = *(long *)(this + 0x30);
  uVar19 = *(ulong *)(this + 0x98);
  uVar16 = (uint)uVar19;
  if ((uVar16 >> 0x14 & 1) == 0) {
    numPrimitives = 0;
  }
  else {
    numPrimitives = *(ulong *)(lVar14 + 0x290);
  }
  if ((uVar16 >> 0x15 & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar14 + 0x2a0);
  }
  if ((uVar19 & 0xf) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar14 + 0x2c0);
  }
  if ((uVar19 & 0x77770) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar14 + 0x2b0);
  }
  if ((uVar19 & 0xe000000) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar14 + 0x340);
  }
  if ((uVar16 >> 0x17 & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar14 + 0x2d0);
  }
  if ((uVar16 >> 0x1d & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar14 + 0x2e0);
  }
  if ((uVar16 >> 0x1e & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar14 + 0x2f0);
  }
  if ((int)uVar16 < 0) {
    numPrimitives = numPrimitives + *(long *)(lVar14 + 0x300);
  }
  if ((uVar16 >> 0x18 & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar14 + 0x310);
  }
  if ((uVar16 >> 0x16 & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar14 + 800);
  }
  if (numPrimitives == 0) {
    lVar14 = *(long *)(this + 0x78);
    if (*(long *)(this + 0x70) != 0) {
      *(undefined8 *)(this + 0x70) = 0;
    }
    if (*(long *)(this + 0x78) == lVar14) {
      *(undefined8 *)(this + 0x70) = 0;
    }
    else {
      pvVar4 = *(void **)(this + 0x80);
      if (lVar14 != 0) {
        (**(code **)**(undefined8 **)(this + 0x60))(*(undefined8 **)(this + 0x60),lVar14 << 5,0);
      }
      sVar20 = lVar14 << 5;
      if (sVar20 < 0x1c00000) {
        pvVar13 = alignedMalloc(sVar20,0x20);
      }
      else {
        pvVar13 = os_malloc(sVar20,(bool *)(this + 0x68));
      }
      *(void **)(this + 0x80) = pvVar13;
      if (*(long *)(this + 0x70) != 0) {
        lVar12 = 0x10;
        uVar19 = 0;
        do {
          lVar2 = *(long *)(this + 0x80);
          puVar23 = (undefined8 *)((long)pvVar4 + lVar12 + -0x10);
          uVar7 = puVar23[1];
          puVar5 = (undefined8 *)(lVar2 + -0x10 + lVar12);
          *puVar5 = *puVar23;
          puVar5[1] = uVar7;
          uVar7 = ((undefined8 *)((long)pvVar4 + lVar12))[1];
          puVar23 = (undefined8 *)(lVar2 + lVar12);
          *puVar23 = *(undefined8 *)((long)pvVar4 + lVar12);
          puVar23[1] = uVar7;
          uVar19 = uVar19 + 1;
          lVar12 = lVar12 + 0x20;
        } while (uVar19 < *(ulong *)(this + 0x70));
      }
      lVar12 = *(long *)(this + 0x78);
      if (pvVar4 != (void *)0x0) {
        if ((ulong)(lVar12 << 5) < 0x1c00000) {
          alignedFree(pvVar4);
        }
        else {
          os_free(pvVar4,lVar12 << 5,(bool)this[0x68]);
        }
      }
      if (lVar12 != 0) {
        (**(code **)**(undefined8 **)(this + 0x60))(*(undefined8 **)(this + 0x60),lVar12 * -0x20,1);
      }
      *(undefined8 *)(this + 0x70) = 0;
      *(long *)(this + 0x78) = lVar14;
    }
    context.my_cpu_ctl_env = 0x7f8000007f800000;
    context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)0x7f800000;
    context.my_version = gold_2021U1;
    context.my_traits = (context_traits)0x0;
    context.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x80;
    context.my_lifetime_state._M_i = 0x7f;
    context.field_6.my_parent = (task_group_context *)0xff800000ff800000;
    context.my_context_list = (context_list *)0xff800000ff800000;
    context.my_node.my_prev_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_node.my_next_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_exception._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    context.my_itt_caller = (void *)0xff800000ff800000;
    BVHN<4>::set(*(BVHN<4> **)(this + 0x28),(NodeRef)0x8,(LBBox3fa *)&context,0);
  }
  else {
    auVar26._8_4_ = (int)(numPrimitives >> 0x20);
    auVar26._0_8_ = numPrimitives;
    auVar26._12_4_ = 0x45300000;
    dVar25 = ((auVar26._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)numPrimitives) - 4503599627370496.0)) * 1.2 * 8.0;
    uVar19 = (ulong)dVar25;
    FastAllocator::init_estimate
              ((FastAllocator *)(*(long *)(this + 0x28) + 0x78),
               ((long)(dVar25 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19) +
               (numPrimitives & 0xffffffffffffff) * 0x40);
    pBVar21 = *(BVHN<4> **)(this + 0x28);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct((ulong)&__str,'\x01');
    *__str._M_dataplus._M_p = '4';
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x1ffdf3e);
    pPVar22 = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(plVar11 + 2);
    if ((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)*plVar11 == pPVar22) {
      body.my_reduction =
           *(anon_class_1_0_00000001 **)
            &(pPVar22->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0;
      body._24_8_ = plVar11[3];
      body.my_identity_element = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&body.my_reduction;
    }
    else {
      body.my_reduction =
           *(anon_class_1_0_00000001 **)
            &(pPVar22->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0;
      body.my_identity_element = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)*plVar11;
    }
    body.my_real_body = (anon_class_16_2_ed117de8_conflict33 *)plVar11[1];
    *plVar11 = (long)pPVar22;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&body);
    paVar17 = (anon_union_8_2_d71db6ad_for_task_group_context_11 *)(plVar11 + 2);
    if ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)*plVar11 == paVar17) {
      context.field_6 = *paVar17;
      context.my_context_list = (context_list *)plVar11[3];
      context.my_cpu_ctl_env = (uint64_t)&context.field_6;
    }
    else {
      context.field_6 = *paVar17;
      context.my_cpu_ctl_env = (uint64_t)*plVar11;
    }
    context._8_8_ = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    dVar25 = BVHN<4>::preBuild(pBVar21,(string *)&context);
    if ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)context.my_cpu_ctl_env !=
        &context.field_6) {
      operator_delete((void *)context.my_cpu_ctl_env);
    }
    if (body.my_identity_element != (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&body.my_reduction)
    {
      operator_delete(body.my_identity_element);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p);
    }
    lVar14 = *(long *)(this + 0x28);
    if ((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)
        (*(long *)(lVar14 + 0x208) - *(long *)(lVar14 + 0x200) >> 3) < __new_size) {
      std::vector<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>::resize
                ((vector<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_> *)(lVar14 + 0x200),
                 (size_type)__new_size);
    }
    if ((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)
        (*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3) < __new_size) {
      std::
      vector<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::RefBuilderBase>_>_>_>
      ::resize((vector<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::RefBuilderBase>_>_>_>
                *)(this + 0x10),(size_type)__new_size);
    }
    resizeRefsList(this);
    LOCK();
    *(undefined4 *)(this + 0x88) = 0;
    UNLOCK();
    context.my_version = proxy_support;
    context.my_traits = (context_traits)0x4;
    context.my_node.my_prev_node = (intrusive_list_node *)0x0;
    context.my_node.my_next_node = (intrusive_list_node *)0x0;
    context.my_name = CUSTOM_CTX;
    local_138._0_8_ = this;
    tbb::detail::r1::initialize(&context);
    body.my_real_body = (anon_class_16_2_ed117de8_conflict33 *)0x0;
    body.my_reduction = (anon_class_1_0_00000001 *)0x1;
    __str._M_dataplus._M_p = (pointer)&local_138;
    body.my_identity_element = __new_size;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&body,(anon_class_8_1_898bcfc2 *)&__str,
          (auto_partitioner *)&local_e8,&context);
    cVar10 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar10 != '\0') {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar15,"task cancelled");
      __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&context);
    context.my_version = proxy_support;
    context.my_traits = (context_traits)0x4;
    context.my_node.my_prev_node = (intrusive_list_node *)0x0;
    context.my_node.my_next_node = (intrusive_list_node *)0x0;
    context.my_name = CUSTOM_CTX;
    local_138._0_8_ = this;
    tbb::detail::r1::initialize(&context);
    body.my_real_body = (anon_class_16_2_ed117de8_conflict33 *)0x0;
    body.my_reduction = (anon_class_1_0_00000001 *)0x1;
    __str._M_dataplus._M_p = (pointer)&local_138;
    body.my_identity_element = __new_size;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&body,(anon_class_8_1_898bcfc2 *)&__str,
          (auto_partitioner *)&local_e8,&context);
    cVar10 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar10 != '\0') {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar15,"task cancelled");
      __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&context);
    if (*(int *)(this + 0x88) == 1) {
      pBVar21 = *(BVHN<4> **)(this + 0x28);
      puVar1 = *(uint64_t **)(this + 0x58);
      root.ptr = puVar1[4];
      context.my_cpu_ctl_env = *puVar1;
      context._8_8_ = puVar1[1];
      context.field_6 = *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(puVar1 + 2);
      context.my_context_list = (context_list *)puVar1[3];
      bounds = &context;
      context.my_node.my_prev_node = (intrusive_list_node *)context.my_cpu_ctl_env;
      context.my_node.my_next_node = (intrusive_list_node *)context._8_8_;
      context.my_exception._M_b._M_p = (__base_type)(__base_type)context.field_6;
      context.my_itt_caller = context.my_context_list;
    }
    else {
      uVar24 = (ulong)*(int *)(this + 0x88);
      uVar19 = *(ulong *)(this + 0x50);
      uVar18 = uVar19;
      if ((uVar19 < uVar24) && (uVar18 = uVar24, uVar19 != 0)) {
        while (uVar18 = uVar19, uVar18 < uVar24) {
          uVar19 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0);
        }
      }
      if (uVar24 < *(ulong *)(this + 0x48)) {
        *(ulong *)(this + 0x48) = uVar24;
      }
      if (*(ulong *)(this + 0x50) == uVar18) {
        *(ulong *)(this + 0x48) = uVar24;
      }
      else {
        pvVar4 = *(void **)(this + 0x58);
        if (uVar18 != 0) {
          (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),uVar18 << 6,0);
        }
        sVar20 = uVar18 << 6;
        if (sVar20 < 0x1c00000) {
          pvVar13 = alignedMalloc(sVar20,0x20);
        }
        else {
          pvVar13 = os_malloc(sVar20,(bool *)(this + 0x40));
        }
        *(void **)(this + 0x58) = pvVar13;
        if (*(long *)(this + 0x48) != 0) {
          lVar14 = 0x20;
          uVar19 = 0;
          do {
            lVar12 = *(long *)(this + 0x58);
            puVar23 = (undefined8 *)((long)pvVar4 + lVar14 + -0x20);
            uVar7 = puVar23[1];
            puVar5 = (undefined8 *)(lVar12 + -0x20 + lVar14);
            *puVar5 = *puVar23;
            puVar5[1] = uVar7;
            puVar23 = (undefined8 *)((long)pvVar4 + lVar14 + -0x10);
            uVar7 = puVar23[1];
            puVar5 = (undefined8 *)(lVar12 + -0x10 + lVar14);
            *puVar5 = *puVar23;
            puVar5[1] = uVar7;
            *(undefined4 *)(lVar12 + 8 + lVar14) = *(undefined4 *)((long)pvVar4 + lVar14 + 8);
            *(undefined8 *)(lVar12 + lVar14) = *(undefined8 *)((long)pvVar4 + lVar14);
            uVar19 = uVar19 + 1;
            lVar14 = lVar14 + 0x40;
          } while (uVar19 < *(ulong *)(this + 0x48));
        }
        lVar14 = *(long *)(this + 0x50);
        if (pvVar4 != (void *)0x0) {
          if ((ulong)(lVar14 << 6) < 0x1c00000) {
            alignedFree(pvVar4);
          }
          else {
            os_free(pvVar4,lVar14 << 6,(bool)this[0x40]);
          }
        }
        if (lVar14 != 0) {
          (**(code **)**(undefined8 **)(this + 0x38))
                    (*(undefined8 **)(this + 0x38),lVar14 * -0x40,1);
        }
        *(ulong *)(this + 0x48) = uVar24;
        *(ulong *)(this + 0x50) = uVar18;
      }
      uVar3 = *(unsigned_long *)(this + 0x48);
      uVar19 = uVar3 * 2;
      uVar18 = (ulong)((float)numPrimitives / 1000.0);
      uVar18 = (long)((float)numPrimitives / 1000.0 - 9.223372e+18) & (long)uVar18 >> 0x3f | uVar18;
      if (uVar18 < uVar19) {
        uVar18 = uVar19;
      }
      uVar19 = 1000;
      if (1000 < uVar18) {
        uVar19 = uVar18;
      }
      local_138._0_8_ =
           (BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive> *)
           0x7f8000007f800000;
      local_138._8_8_ = 0x7f8000007f800000;
      local_128 = 0xff800000ff800000;
      uStack_120 = 0xff800000ff800000;
      local_118 = 0x7f8000007f800000;
      uStack_110 = 0x7f8000007f800000;
      local_108 = 0xff800000ff800000;
      uStack_100 = 0xff800000ff800000;
      local_f8 = 0;
      sStack_f0 = 0;
      local_48.func = &local_d0;
      context.my_version = proxy_support;
      context.my_traits = (context_traits)0x4;
      context.my_node.my_prev_node = (intrusive_list_node *)0x0;
      context.my_node.my_next_node = (intrusive_list_node *)0x0;
      context.my_name = CUSTOM_CTX;
      local_d0.this = (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)this;
      local_48.identity = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_138;
      local_48.reduction = &local_229;
      tbb::detail::r1::initialize(&context);
      local_e8.my_begin = 0;
      local_e8.my_grainsize = 1;
      body.my_real_body = &local_58;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
           local_138._0_8_;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
           local_138._8_8_;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
           local_128;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
           uStack_120;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           local_118;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           uStack_110;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           local_108;
      body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           uStack_100;
      body.my_value.begin = local_f8;
      body.my_value.end = sStack_f0;
      local_e8.my_end = uVar3;
      body.my_identity_element = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_138;
      body.my_reduction = &local_229;
      local_58.reduction = &local_229;
      local_58.func = &local_48;
      tbb::detail::d1::
      start_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_twolevel.cpp:146:16)>,_const_tbb::detail::d1::auto_partitioner>
      ::run(&local_e8,&body,(auto_partitioner *)&__str,&context);
      sVar8 = body.my_value.end;
      sVar20 = body.my_value.begin;
      __str._M_dataplus._M_p =
           (pointer)body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                    field_0._0_8_;
      __str._M_string_length =
           body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.
           _8_8_;
      __str.field_2._M_allocated_capacity =
           body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
           _0_8_;
      __str.field_2._8_8_ =
           body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
           _8_8_;
      cVar10 = tbb::detail::r1::is_group_execution_cancelled(&context);
      if (cVar10 != '\0') {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar15,"task cancelled");
        __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy(&context);
      if (sVar8 == sVar20) {
        pBVar21 = *(BVHN<4> **)(this + 0x28);
        bounds = &context;
        context.my_cpu_ctl_env = 0x7f8000007f800000;
        context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
             (__atomic_base<unsigned_int>)0x7f800000;
        context.my_version = gold_2021U1;
        context.my_traits = (context_traits)0x0;
        context.my_state.super___atomic_base<unsigned_char>._M_i =
             (__atomic_base<unsigned_char>)0x80;
        context.my_lifetime_state._M_i = 0x7f;
        context.field_6.my_parent = (task_group_context *)0xff800000ff800000;
        context.my_context_list = (context_list *)0xff800000ff800000;
        context.my_node.my_prev_node = (intrusive_list_node *)0x7f8000007f800000;
        context.my_node.my_next_node = (intrusive_list_node *)0x7f8000007f800000;
        context.my_exception._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
        context.my_itt_caller = (void *)0xff800000ff800000;
        root.ptr = 8;
        numPrimitives = 0;
      }
      else {
        context.my_context_list = (context_list *)0x1;
        context.my_node.my_next_node = (intrusive_list_node *)&DAT_3f8000003f800000;
        context.my_itt_caller = (void *)0xffffffffffffffff;
        context.my_cpu_ctl_env = 4;
        context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
             (__atomic_base<unsigned_int>)0x28;
        context.my_version = gold_2021U1;
        context.my_traits = (context_traits)0x0;
        context.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x0
        ;
        context.my_lifetime_state._M_i = created;
        for (iVar6 = 0x1f; 4U >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
        context.field_6 = (anon_union_8_2_d71db6ad_for_task_group_context_11)(long)iVar6;
        context.my_node.my_prev_node = (intrusive_list_node *)0x1;
        context.my_exception._M_b._M_p = *(__base_type *)(this + 0x90);
        uVar18 = *(ulong *)(this + 0x50);
        uVar24 = uVar18;
        if ((uVar18 < uVar19) && (uVar24 = uVar19, uVar9 = uVar18, uVar18 != 0)) {
          while (uVar24 = uVar9, uVar18 < uVar19) {
            uVar18 = uVar24 * 2;
            uVar9 = uVar18 + (uVar18 == 0);
          }
        }
        if (uVar19 < *(ulong *)(this + 0x48)) {
          *(ulong *)(this + 0x48) = uVar19;
        }
        if (*(ulong *)(this + 0x50) == uVar24) {
          *(ulong *)(this + 0x48) = uVar19;
        }
        else {
          pvVar4 = *(void **)(this + 0x58);
          if (uVar24 != 0) {
            (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),uVar24 << 6,0)
            ;
          }
          sVar20 = uVar24 << 6;
          if (sVar20 < 0x1c00000) {
            pvVar13 = alignedMalloc(sVar20,0x20);
          }
          else {
            pvVar13 = os_malloc(sVar20,(bool *)(this + 0x40));
          }
          *(void **)(this + 0x58) = pvVar13;
          if (*(long *)(this + 0x48) != 0) {
            lVar14 = 0x20;
            uVar18 = 0;
            do {
              lVar12 = *(long *)(this + 0x58);
              puVar23 = (undefined8 *)((long)pvVar4 + lVar14 + -0x20);
              uVar7 = puVar23[1];
              puVar5 = (undefined8 *)(lVar12 + -0x20 + lVar14);
              *puVar5 = *puVar23;
              puVar5[1] = uVar7;
              puVar23 = (undefined8 *)((long)pvVar4 + lVar14 + -0x10);
              uVar7 = puVar23[1];
              puVar5 = (undefined8 *)(lVar12 + -0x10 + lVar14);
              *puVar5 = *puVar23;
              puVar5[1] = uVar7;
              *(undefined4 *)(lVar12 + 8 + lVar14) = *(undefined4 *)((long)pvVar4 + lVar14 + 8);
              *(undefined8 *)(lVar12 + lVar14) = *(undefined8 *)((long)pvVar4 + lVar14);
              uVar18 = uVar18 + 1;
              lVar14 = lVar14 + 0x40;
            } while (uVar18 < *(ulong *)(this + 0x48));
          }
          lVar14 = *(long *)(this + 0x50);
          if (pvVar4 != (void *)0x0) {
            if ((ulong)(lVar14 << 6) < 0x1c00000) {
              alignedFree(pvVar4);
            }
            else {
              os_free(pvVar4,lVar14 << 6,(bool)this[0x40]);
            }
          }
          if (lVar14 != 0) {
            (**(code **)**(undefined8 **)(this + 0x38))
                      (*(undefined8 **)(this + 0x38),lVar14 * -0x40,1);
          }
          *(ulong *)(this + 0x48) = uVar19;
          *(ulong *)(this + 0x50) = uVar24;
        }
        root = BVHBuilderBinnedOpenMergeSAH::
               build<embree::NodeRefPtr<4>,embree::sse2::BVHNBuilderTwoLevel<4,embree::InstanceArray,embree::InstanceArrayPrimitive>::BuildRef,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::BVHNBuilderTwoLevel<4,embree::InstanceArray,embree::InstanceArrayPrimitive>::build()::_lambda(embree::sse2::BVHNBuilderTwoLevel<4,embree::InstanceArray,embree::InstanceArrayPrimitive>::BuildRef_const*,embree::range<unsigned_long>const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::sse2::BVHNBuilderTwoLevel<4,embree::InstanceArray,embree::InstanceArrayPrimitive>::build()::_lambda(embree::sse2::BVHNBuilderTwoLevel<4,embree::InstanceArray,embree::InstanceArrayPrimitive>::BuildRef&,embree::sse2::BVHNBuilderTwoLevel<4,embree::InstanceArray,embree::InstanceArrayPrimitive>::BuildRef*)_1_,embree::sse2::BVHNBuilderTwoLevel<4,embree::InstanceArray,embree::InstanceArrayPrimitive>::build()::_lambda(unsigned_long)_1_>
                         (*(long *)(this + 0x28) + 0x78,&body,this,this,*(undefined8 *)(this + 0x58)
                          ,uVar19,&__str,&context);
        pBVar21 = *(BVHN<4> **)(this + 0x28);
        body.my_identity_element =
             (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)__str._M_dataplus._M_p;
        body.my_real_body = (anon_class_16_2_ed117de8_conflict33 *)__str._M_string_length;
        body.my_reduction = (anon_class_1_0_00000001 *)__str.field_2._M_allocated_capacity;
        body._24_8_ = __str.field_2._8_8_;
        body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
             __str._M_dataplus._M_p;
        body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
             __str._M_string_length;
        body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
             __str.field_2._M_allocated_capacity;
        body.my_value.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
             __str.field_2._8_8_;
        bounds = (task_group_context *)&body;
      }
    }
    BVHN<4>::set(pBVar21,(NodeRef)root.ptr,(LBBox3fa *)bounds,numPrimitives);
    lVar14 = *(long *)(this + 0x28);
    FastAllocator::internal_fix_used_blocks((FastAllocator *)(lVar14 + 0x78));
    puVar5 = *(undefined8 **)(lVar14 + 0x1b0);
    for (puVar23 = *(undefined8 **)(lVar14 + 0x1a8); puVar23 != puVar5; puVar23 = puVar23 + 1) {
      FastAllocator::ThreadLocal2::unbind((ThreadLocal2 *)*puVar23,(FastAllocator *)(lVar14 + 0x78))
      ;
    }
    if (*(long *)(lVar14 + 0x1b0) != *(long *)(lVar14 + 0x1a8)) {
      *(long *)(lVar14 + 0x1b0) = *(long *)(lVar14 + 0x1a8);
    }
    BVHN<4>::postBuild(*(BVHN<4> **)(this + 0x28),dVar25);
  }
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::build()
    {
      /* delete some objects */
      size_t num = scene->size();
      if (num < bvh->objects.size()) {
        parallel_for(num, bvh->objects.size(), [&] (const range<size_t>& r) {
            for (size_t i=r.begin(); i<r.end(); i++) {
              builders[i].reset();
              delete bvh->objects[i]; bvh->objects[i] = nullptr;
            }
          });
      }
      
#if PROFILE
      while(1) 
#endif
      {
      /* reset memory allocator */
      bvh->alloc.reset();
      
      /* skip build for empty scene */
      const size_t numPrimitives = scene->getNumPrimitives(gtype,false);

      if (numPrimitives == 0) {
        prims.resize(0);
        bvh->set(BVH::emptyNode,empty,0);
        return;
      }

      /* calculate the size of the entire BVH */
      const size_t numLeafBlocks = Primitive::blocks(numPrimitives);
      const size_t node_bytes = 2*numLeafBlocks*sizeof(typename BVH::AABBNode)/N;
      const size_t leaf_bytes = size_t(1.2*numLeafBlocks*sizeof(Primitive));
      bvh->alloc.init_estimate(node_bytes+leaf_bytes); 

      double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "BuilderTwoLevel");

      /* resize object array if scene got larger */
      if (bvh->objects.size()  < num) bvh->objects.resize(num);
      if (builders.size() < num) builders.resize(num);
      resizeRefsList ();
      nextRef.store(0);
      
      /* create acceleration structures */
      parallel_for(size_t(0), num, [&] (const range<size_t>& r)
      {
        for (size_t objectID=r.begin(); objectID<r.end(); objectID++)
        {
          Mesh* mesh = scene->getSafe<Mesh>(objectID);
      
          /* ignore meshes we do not support */
          if (mesh == nullptr || mesh->numTimeSteps != 1)
            continue;
          
          if (isSmallGeometry(mesh)) {
             setupSmallBuildRefBuilder (objectID, mesh);
          } else {
            setupLargeBuildRefBuilder (objectID, mesh);
          }
        }
      });

      /* parallel build of acceleration structures */
      parallel_for(size_t(0), num, [&] (const range<size_t>& r)
      {
        for (size_t objectID=r.begin(); objectID<r.end(); objectID++)
        {
          /* ignore if no triangle mesh or not enabled */
          Mesh* mesh = scene->getSafe<Mesh>(objectID);
          if (mesh == nullptr || !mesh->isEnabled() || mesh->numTimeSteps != 1) 
            continue;

          builders[objectID]->attachBuildRefs (this);
        }
      });


#if PROFILE
      double d0 = getSeconds();
#endif
      /* fast path for single geometry scenes */
      if (nextRef == 1) { 
        bvh->set(refs[0].node,LBBox3fa(refs[0].bounds()),numPrimitives);
      }

      else
      {     
        /* open all large nodes */
        refs.resize(nextRef);

        /* this probably needs some more tuning */
        const size_t extSize = max(max((size_t)SPLIT_MIN_EXT_SPACE,refs.size()*SPLIT_MEMORY_RESERVE_SCALE),size_t((float)numPrimitives / SPLIT_MEMORY_RESERVE_FACTOR));
 
#if !ENABLE_DIRECT_SAH_MERGE_BUILDER

#if ENABLE_OPEN_SEQUENTIAL
        open_sequential(extSize); 
#endif
        /* compute PrimRefs */
        prims.resize(refs.size());
#endif
        
        {
#if ENABLE_DIRECT_SAH_MERGE_BUILDER

          const PrimInfo pinfo = parallel_reduce(size_t(0), refs.size(),  PrimInfo(empty), [&] (const range<size_t>& r) -> PrimInfo {

              PrimInfo pinfo(empty);
              for (size_t i=r.begin(); i<r.end(); i++) {
                pinfo.add_center2(refs[i]);
              }
              return pinfo;
            }, [] (const PrimInfo& a, const PrimInfo& b) { return PrimInfo::merge(a,b); });
          
#else
          const PrimInfo pinfo = parallel_reduce(size_t(0), refs.size(),  PrimInfo(empty), [&] (const range<size_t>& r) -> PrimInfo {

              PrimInfo pinfo(empty);
              for (size_t i=r.begin(); i<r.end(); i++) {
                pinfo.add_center2(refs[i]);
                prims[i] = PrimRef(refs[i].bounds(),(size_t)refs[i].node);
              }
              return pinfo;
            }, [] (const PrimInfo& a, const PrimInfo& b) { return PrimInfo::merge(a,b); });
#endif   
       
          /* skip if all objects where empty */
          if (pinfo.size() == 0)
            bvh->set(BVH::emptyNode,empty,0);
        
          /* otherwise build toplevel hierarchy */
          else
          {
            /* settings for BVH build */
            GeneralBVHBuilder::Settings settings;
            settings.branchingFactor = N;
            settings.maxDepth = BVH::maxBuildDepthLeaf;
            settings.logBlockSize = bsr(N);
            settings.minLeafSize = 1;
            settings.maxLeafSize = 1;
            settings.travCost = 1.0f;
            settings.intCost = 1.0f;
            settings.singleThreadThreshold = singleThreadThreshold;
      
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            
            refs.resize(extSize); 
         
            NodeRef root = BVHBuilderBinnedOpenMergeSAH::build<NodeRef,BuildRef>(
              typename BVH::CreateAlloc(bvh),
              typename BVH::AABBNode::Create2(),
              typename BVH::AABBNode::Set2(),
              
              [&] (const BuildRef* refs, const range<size_t>& range, const FastAllocator::CachedAllocator& alloc) -> NodeRef  {
                assert(range.size() == 1);
                return (NodeRef) refs[range.begin()].node;
              },
              [&] (BuildRef &bref, BuildRef *refs) -> size_t { 
                return openBuildRef(bref,refs);
              },              
              [&] (size_t dn) { bvh->scene->progressMonitor(0); },
              refs.data(),extSize,pinfo,settings);
#else
            NodeRef root = BVHBuilderBinnedSAH::build<NodeRef>(
              typename BVH::CreateAlloc(bvh),
              typename BVH::AABBNode::Create2(),
              typename BVH::AABBNode::Set2(),
              
              [&] (const PrimRef* prims, const range<size_t>& range, const FastAllocator::CachedAllocator& alloc) -> NodeRef {
                assert(range.size() == 1);
                return (NodeRef) prims[range.begin()].ID();
              },
              [&] (size_t dn) { bvh->scene->progressMonitor(0); },
              prims.data(),pinfo,settings);
#endif

            
            bvh->set(root,LBBox3fa(pinfo.geomBounds),numPrimitives);
          }
        }
      }  
        
      bvh->alloc.cleanup();
      bvh->postBuild(t0);
#if PROFILE
      double d1 = getSeconds();
      std::cout << "TOP_LEVEL OPENING/REBUILD TIME " << 1000.0*(d1-d0) << " ms" << std::endl;
#endif
      }

    }
    
    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::deleteGeometry(size_t geomID)
    {
      if (geomID >= bvh->objects.size()) return;
      if (builders[geomID]) builders[geomID].reset();
      delete bvh->objects [geomID]; bvh->objects [geomID] = nullptr;
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::clear()
    {
      for (size_t i=0; i<bvh->objects.size(); i++) 
        if (bvh->objects[i]) bvh->objects[i]->clear();

      for (size_t i=0; i<builders.size(); i++) 
        if (builders[i]) builders[i].reset();

      refs.clear();
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::open_sequential(const size_t extSize)
    {
      if (refs.size() == 0)
	return;

      refs.reserve(extSize);

#if 1
      for (size_t i=0;i<refs.size();i++)
      {
        NodeRef ref = refs[i].node;
        if (ref.isAABBNode())
          BVH::prefetch(ref);
      }
#endif

      std::make_heap(refs.begin(),refs.end());
      while (refs.size()+N-1 <= extSize)
      {
        std::pop_heap (refs.begin(),refs.end()); 
        NodeRef ref = refs.back().node;
        if (ref.isLeaf()) break;
        refs.pop_back();    
        
        AABBNode* node = ref.getAABBNode();
        for (size_t i=0; i<N; i++) {
          if (node->child(i) == BVH::emptyNode) continue;
          refs.push_back(BuildRef(node->bounds(i),node->child(i)));
         
#if 1
          NodeRef ref_pre = node->child(i);
          if (ref_pre.isAABBNode())
            ref_pre.prefetch();
#endif
          std::push_heap (refs.begin(),refs.end()); 
        }
      }
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupSmallBuildRefBuilder (size_t objectID, Mesh const * const /*mesh*/)
    {
      if (builders[objectID] == nullptr ||                                         // new mesh
          dynamic_cast<RefBuilderSmall*>(builders[objectID].get()) == nullptr)     // size change resulted in large->small change
      {
        builders[objectID].reset (new RefBuilderSmall(objectID));
      }
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupLargeBuildRefBuilder (size_t objectID, Mesh const * const mesh)
    {
      if (bvh->objects[objectID] == nullptr ||                                  // new mesh
          builders[objectID]->meshQualityChanged (mesh->quality) ||             // changed build quality
          dynamic_cast<RefBuilderLarge*>(builders[objectID].get()) == nullptr)  // size change resulted in small->large change
      {
        Builder* builder = nullptr;
        delete bvh->objects[objectID]; 
        createMeshAccel(objectID, builder);
        builders[objectID].reset (new RefBuilderLarge(objectID, builder, mesh->quality));
      }
    }

#if defined(EMBREE_GEOMETRY_TRIANGLE)
    Builder* BVH4BuilderTwoLevelTriangle4MeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH4BuilderTwoLevelTriangle4vMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4v>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH4BuilderTwoLevelTriangle4iMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4i>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_QUAD)
    Builder* BVH4BuilderTwoLevelQuadMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
    return new BVHNBuilderTwoLevel<4,QuadMesh,Quad4v>((BVH4*)bvh,scene,QuadMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_USER)
    Builder* BVH4BuilderTwoLevelVirtualSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
    return new BVHNBuilderTwoLevel<4,UserGeometry,Object>((BVH4*)bvh,scene,UserGeometry::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE)
    Builder* BVH4BuilderTwoLevelInstanceSAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,Instance,InstancePrimitive>((BVH4*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE_ARRAY)
    Builder* BVH4BuilderTwoLevelInstanceArraySAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,InstanceArray,InstanceArrayPrimitive>((BVH4*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(__AVX__)
#if defined(EMBREE_GEOMETRY_TRIANGLE)
    Builder* BVH8BuilderTwoLevelTriangle4MeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH8BuilderTwoLevelTriangle4vMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4v>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH8BuilderTwoLevelTriangle4iMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4i>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_QUAD)
    Builder* BVH8BuilderTwoLevelQuadMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,QuadMesh,Quad4v>((BVH8*)bvh,scene,QuadMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_USER)
    Builder* BVH8BuilderTwoLevelVirtualSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,UserGeometry,Object>((BVH8*)bvh,scene,UserGeometry::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE)
    Builder* BVH8BuilderTwoLevelInstanceSAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,Instance,InstancePrimitive>((BVH8*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE_ARRAY)
    Builder* BVH8BuilderTwoLevelInstanceArraySAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,InstanceArray,InstanceArrayPrimitive>((BVH8*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#endif
  }